

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fraCec.c
# Opt level: O2

int Fra_FraigCecTop(Aig_Man_t *pMan1,Aig_Man_t *pMan2,int nConfLimit,int nPartSize,int fSmart,
                   int fVerbose)

{
  int iVar1;
  abctime aVar2;
  abctime aVar3;
  char *pcVar4;
  int level;
  char *__format;
  Aig_Man_t *pMan1_00;
  
  aVar2 = Abc_Clock();
  pMan1_00 = pMan1;
  if (pMan1->nObjs[6] + pMan1->nObjs[5] < pMan2->nObjs[6] + pMan2->nObjs[5]) {
    pMan1_00 = pMan2;
    pMan2 = pMan1;
  }
  if (pMan2->nObjs[6] + pMan2->nObjs[5] <= pMan1_00->nObjs[6] + pMan1_00->nObjs[5]) {
    if (nPartSize == 0) {
      nPartSize = pMan1_00->nObjs[3];
      fSmart = 0;
    }
    iVar1 = Fra_FraigCecPartitioned(pMan1_00,pMan2,nConfLimit,nPartSize,fSmart,fVerbose);
    pcVar4 = "Networks are UNDECIDED.   ";
    if (iVar1 == 0) {
      pcVar4 = "Networks are NOT EQUIVALENT.   ";
    }
    __format = "Networks are equivalent.   ";
    if (iVar1 != 1) {
      __format = pcVar4;
    }
    printf(__format);
    level = (int)__format;
    Abc_Print(level,"%s =","Time");
    aVar3 = Abc_Clock();
    Abc_Print(level,"%9.2f sec\n",(double)(aVar3 - aVar2) / 1000000.0);
    fflush(_stdout);
    return iVar1;
  }
  __assert_fail("Aig_ManNodeNum(pMan1) >= Aig_ManNodeNum(pMan2)",
                "/workspace/llm4binary/github/license_all_cmakelists_25/antmicro[P]abc-lib/src/proof/fra/fraCec.c"
                ,0x21c,"int Fra_FraigCecTop(Aig_Man_t *, Aig_Man_t *, int, int, int, int)");
}

Assistant:

int Fra_FraigCecTop( Aig_Man_t * pMan1, Aig_Man_t * pMan2, int nConfLimit, int nPartSize, int fSmart, int fVerbose )
{
    Aig_Man_t * pTemp;
    //Abc_NtkDarCec( pNtk1, pNtk2, fPartition, fVerbose );
    int RetValue;
    abctime clkTotal = Abc_Clock();

    if ( Aig_ManCiNum(pMan1) != Aig_ManCiNum(pMan1) )
    {
        printf( "Abc_CommandAbc8Cec(): Miters have different number of PIs.\n" );
        return 0;
    }
    if ( Aig_ManCoNum(pMan1) != Aig_ManCoNum(pMan1) )
    {
        printf( "Abc_CommandAbc8Cec(): Miters have different number of POs.\n" );
        return 0;
    }
    assert( Aig_ManCiNum(pMan1) == Aig_ManCiNum(pMan1) );
    assert( Aig_ManCoNum(pMan1) == Aig_ManCoNum(pMan1) );

    // make sure that the first miter has more nodes
    if ( Aig_ManNodeNum(pMan1) < Aig_ManNodeNum(pMan2) )
    {
        pTemp = pMan1;
        pMan1 = pMan2;
        pMan2 = pTemp;
    }
    assert( Aig_ManNodeNum(pMan1) >= Aig_ManNodeNum(pMan2) );

    if ( nPartSize )
        RetValue = Fra_FraigCecPartitioned( pMan1, pMan2, nConfLimit, nPartSize, fSmart, fVerbose );
    else // no partitioning
        RetValue = Fra_FraigCecPartitioned( pMan1, pMan2, nConfLimit, Aig_ManCoNum(pMan1), 0, fVerbose );

    // report the miter
    if ( RetValue == 1 )
    {
        printf( "Networks are equivalent.   " );
ABC_PRT( "Time", Abc_Clock() - clkTotal );
    }
    else if ( RetValue == 0 )
    {
        printf( "Networks are NOT EQUIVALENT.   " );
ABC_PRT( "Time", Abc_Clock() - clkTotal );
    }
    else
    {
        printf( "Networks are UNDECIDED.   " );
ABC_PRT( "Time", Abc_Clock() - clkTotal );
    }
    fflush( stdout );
    return RetValue;
}